

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::ubjson::basic_ubjson_parser<jsoncons::bytes_source,_std::allocator<char>_>::reset
          (basic_ubjson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this)

{
  parse_mode *in_RDI;
  vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
  *unaff_retaddr;
  uint7 in_stack_ffffffffffffffe8;
  parse_mode *__args;
  
  *(undefined1 *)(in_RDI + 2) = accept;
  *(byte *)((long)in_RDI + 9) = 0;
  __args = in_RDI;
  std::__cxx11::string::clear();
  std::vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>::clear
            ((vector<jsoncons::ubjson::parse_state,_std::allocator<jsoncons::ubjson::parse_state>_>
              *)0xddd352);
  std::vector<jsoncons::ubjson::parse_state,std::allocator<jsoncons::ubjson::parse_state>>::
  emplace_back<jsoncons::ubjson::parse_mode,int,unsigned_char>
            (unaff_retaddr,__args,(int *)0x0,(uchar *)(ulong)in_stack_ffffffffffffffe8);
  in_RDI[3] = root;
  return;
}

Assistant:

void reset()
    {
        more_ = true;
        done_ = false;
        text_buffer_.clear();
        state_stack_.clear();
        state_stack_.emplace_back(parse_mode::root,0,uint8_t(0));
        nesting_depth_ = 0;
    }